

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlShellPwd(void)

{
  int iVar1;
  int iVar2;
  xmlShellCtxtPtr val;
  xmlNodePtr val_00;
  xmlNodePtr val_01;
  int local_54;
  int n_node2;
  xmlNodePtr node2;
  int n_node;
  xmlNodePtr node;
  int n_buffer;
  char *buffer;
  int n_ctxt;
  xmlShellCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (buffer._4_4_ = 0; (int)buffer._4_4_ < 1; buffer._4_4_ = buffer._4_4_ + 1) {
    for (node._4_4_ = 0; (int)node._4_4_ < 1; node._4_4_ = node._4_4_ + 1) {
      for (node2._4_4_ = 0; (int)node2._4_4_ < 3; node2._4_4_ = node2._4_4_ + 1) {
        for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlShellCtxtPtr(buffer._4_4_,0);
          val_00 = gen_xmlNodePtr(node2._4_4_,2);
          val_01 = gen_xmlNodePtr(local_54,3);
          iVar2 = xmlShellPwd(val,0,val_00,val_01);
          desret_int(iVar2);
          call_tests = call_tests + 1;
          des_xmlShellCtxtPtr(buffer._4_4_,val,0);
          des_xmlNodePtr(node2._4_4_,val_00,2);
          des_xmlNodePtr(local_54,val_01,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlShellPwd",(ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)buffer._4_4_);
            printf(" %d",(ulong)node._4_4_);
            printf(" %d",(ulong)node2._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlShellPwd(void) {
    int test_ret = 0;

#if defined(LIBXML_DEBUG_ENABLED) && defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    int ret_val;
    xmlShellCtxtPtr ctxt; /* the shell context */
    int n_ctxt;
    char * buffer; /* the output buffer */
    int n_buffer;
    xmlNodePtr node; /* a node */
    int n_node;
    xmlNodePtr node2; /* unused */
    int n_node2;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlShellCtxtPtr;n_ctxt++) {
    for (n_buffer = 0;n_buffer < gen_nb_char_ptr;n_buffer++) {
    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_node2 = 0;n_node2 < gen_nb_xmlNodePtr;n_node2++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlShellCtxtPtr(n_ctxt, 0);
        buffer = gen_char_ptr(n_buffer, 1);
        node = gen_xmlNodePtr(n_node, 2);
        node2 = gen_xmlNodePtr(n_node2, 3);

        ret_val = xmlShellPwd(ctxt, buffer, node, node2);
        desret_int(ret_val);
        call_tests++;
        des_xmlShellCtxtPtr(n_ctxt, ctxt, 0);
        des_char_ptr(n_buffer, buffer, 1);
        des_xmlNodePtr(n_node, node, 2);
        des_xmlNodePtr(n_node2, node2, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlShellPwd",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_buffer);
            printf(" %d", n_node);
            printf(" %d", n_node2);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}